

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O0

void __thiscall polyscope::Histogram::Histogram(Histogram *this)

{
  pair<double,_double> *in_RDI;
  Histogram *in_stack_00000060;
  Histogram *in_stack_00000100;
  nullptr_t in_stack_ffffffffffffff78;
  pair<double,_double> *this_00;
  allocator local_15 [21];
  
  std::pair<double,_double>::pair<double,_double,_true>(in_RDI);
  in_RDI[1].first = 9.93071948140906e-322;
  in_RDI[1].second = 2.51973479379036e-322;
  geometrycentral::surface::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x418a44);
  geometrycentral::surface::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x418a57);
  geometrycentral::surface::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x418a6a);
  geometrycentral::surface::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x418a7d);
  std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::vector
            ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)0x418a90)
  ;
  std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::vector
            ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)0x418aa6)
  ;
  std::pair<double,_double>::pair<double,_double,_true>(in_RDI + 0xb);
  *(undefined1 *)&in_RDI[0xc].first = 0;
  *(undefined1 *)((long)&in_RDI[0xc].first + 1) = 0;
  *(undefined1 *)((long)&in_RDI[0xc].first + 2) = 1;
  *(undefined1 *)((long)&in_RDI[0xc].first + 3) = 0;
  *(undefined1 *)((long)&in_RDI[0xc].first + 4) = 0;
  *(undefined1 *)((long)&in_RDI[0xc].first + 5) = 0;
  *(undefined4 *)&in_RDI[0xc].second = 600;
  this_00 = in_RDI + 0xd;
  std::shared_ptr<polyscope::render::TextureBuffer>::shared_ptr
            ((shared_ptr<polyscope::render::TextureBuffer> *)this_00,in_stack_ffffffffffffff78);
  std::shared_ptr<polyscope::render::FrameBuffer>::shared_ptr
            ((shared_ptr<polyscope::render::FrameBuffer> *)this_00,in_stack_ffffffffffffff78);
  std::shared_ptr<polyscope::render::ShaderProgram>::shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)this_00,in_stack_ffffffffffffff78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x10),"viridis",local_15);
  std::allocator<char>::~allocator((allocator<char> *)local_15);
  prepare(in_stack_00000060);
  fillBuffers(in_stack_00000100);
  return;
}

Assistant:

Histogram::Histogram() {
  prepare();
  fillBuffers();
}